

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureTheFlag.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4347a::CtfSeeker::update(CtfSeeker *this,float currentTime,float elapsedTime)

{
  long *plVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  bool bVar5;
  undefined7 extraout_var;
  undefined1 *color;
  long lVar6;
  uint uVar7;
  float fVar8;
  undefined8 uVar9;
  uint extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  float extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  uint extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  float extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vec3 VVar17;
  Vec3 local_168;
  undefined8 local_158;
  float local_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  float fStack_120;
  float fStack_11c;
  float local_10c;
  Vec3 local_108;
  Vec3 local_f8;
  uint local_ec;
  Vec3 local_e8;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  undefined4 uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  Vec3 local_58;
  undefined1 local_48 [16];
  
  local_13c = elapsedTime;
  local_10c = currentTime;
  if (this->state == running) {
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    fVar8 = (float)((ulong)uVar9 >> 0x20) - (anonymous_namespace)::gHomeBaseCenter._4_4_;
    fVar14 = (float)uVar9 - (float)(anonymous_namespace)::gHomeBaseCenter;
    fVar14 = (elapsedTime - DAT_0017b020) * (elapsedTime - DAT_0017b020) +
             fVar14 * fVar14 + fVar8 * fVar8;
    local_128._0_4_ = SQRT(fVar14);
    fVar8 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                      super_SimpleVehicle_3.
                                      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                      .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                      super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
    if ((float)local_128 < fVar8 + 1.5) {
      this->state = atGoal;
      goto LAB_0011dc30;
    }
    if (this->state != running) goto LAB_0011dc30;
    this->lastRunningTime = local_10c;
  }
  else {
LAB_0011dc30:
    fVar14 = this->lastRunningTime + 4.0;
    if ((local_10c <= fVar14) ||
       (OpenSteer::OpenSteerDemo::queueDelayedResetPlugInXXX(), this->state != running)) {
      local_108.z = 0.0;
      local_108.x = 0.0;
      local_108.y = 0.0;
      OpenSteer::SimpleVehicle::applyBrakingForce((SimpleVehicle *)this,0.75,local_13c);
      goto LAB_0011e8f2;
    }
  }
  local_108.z = 0.0;
  local_108.x = 0.0;
  local_108.y = 0.0;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  fStack_94 = (float)((ulong)uVar9 >> 0x20);
  local_98 = (float)uVar9 * 8.0;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))(this);
  uStack_74 = (undefined4)((ulong)uVar9 >> 0x20);
  local_78 = (float)uVar9 + (float)uVar9;
  uStack_70 = extraout_XMM0_Dc;
  uStack_6c = extraout_XMM0_Dd;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
  fVar14 = DAT_0017b020 - fVar14;
  auVar15._0_4_ = (float)(anonymous_namespace)::gHomeBaseCenter - (float)uVar9;
  auVar15._4_4_ = (anonymous_namespace)::gHomeBaseCenter._4_4_ - (float)((ulong)uVar9 >> 0x20);
  auVar15._8_4_ = 0.0 - extraout_XMM0_Dc_00;
  auVar15._12_4_ = 0.0 - extraout_XMM0_Dd_00;
  fVar8 = SQRT(fVar14 * fVar14 + auVar15._0_4_ * auVar15._0_4_ + auVar15._4_4_ * auVar15._4_4_);
  auVar3._4_4_ = fVar8;
  auVar3._0_4_ = fVar8;
  auVar3._8_4_ = fVar8;
  auVar3._12_4_ = fVar8;
  _local_138 = divps(auVar15,auVar3);
  local_48 = ZEXT416((uint)fVar8);
  fVar14 = fVar14 / fVar8;
  local_e8._0_8_ = local_138;
  local_e8.z = fVar14;
  bVar5 = OpenSteer::
          SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
          ::isAside((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                     *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,0.5);
  local_c8 = (undefined1  [8])(CONCAT44(uStack_74,local_78) ^ 0x8000000080000000);
  uStack_c0 = uStack_70 ^ 0x80000000;
  uStack_bc = uStack_6c ^ 0x80000000;
  local_9c = local_78 * -2.0;
  local_d8._0_4_ = (float)local_138._4_4_;
  local_d8._4_4_ = (float)local_138._4_4_;
  fStack_d0 = (float)local_138._4_4_;
  fStack_cc = (float)local_138._4_4_;
  local_ec = (uint)CONCAT71(extraout_var,1);
  lVar6 = 0;
  fVar8 = local_78;
  do {
    plVar1 = *(long **)((long)&(anonymous_namespace)::ctfEnemies + lVar6);
    local_158 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    local_128._0_4_ = fVar8;
    uVar9 = (**(code **)(*plVar1 + 0x40))(plVar1);
    fVar11 = (float)local_158 - (float)uVar9;
    fVar13 = local_158._4_4_ - (float)((ulong)uVar9 >> 0x20);
    local_128._0_4_ =
         SQRT(((float)local_128 - fVar8) * ((float)local_128 - fVar8) +
              fVar11 * fVar11 + fVar13 * fVar13) * 0.3;
    fVar11 = (float)(**(code **)(*plVar1 + 0xd8))(plVar1);
    fVar11 = (float)local_128 / fVar11;
    local_168._0_8_ = (**(code **)(*plVar1 + 0xe8))(fVar11,plVar1);
    local_168.z = fVar11;
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    fVar8 = local_168.x - (float)uVar9;
    local_88 = local_168.y - (float)((ulong)uVar9 >> 0x20);
    fVar11 = local_168.z - fVar11;
    local_b8._0_4_ = fVar8;
    fVar8 = (float)local_138._0_4_ * fVar8 + (float)local_d8 * local_88;
    local_128._0_4_ = fVar14 * fVar11 + fVar8;
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
    local_158._0_4_ = fVar8;
    local_68 = uVar9;
    fVar13 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
    OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
    annotationCircleOrDisk
              ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
               fVar13,&OpenSteer::Vec3::zero,&local_168,
               (Color *)(anonymous_namespace)::clearPathColor,0x14,false,false);
    if (((float)local_c8._0_4_ < (float)local_128) && ((float)local_128 < (float)local_48._0_4_)) {
      fVar12 = (float)local_b8._0_4_ - (float)local_138._0_4_ * (float)local_128;
      fVar13 = local_88 - (float)local_d8 * (float)local_128;
      fVar10 = fVar11 - (float)local_128 * fVar14;
      fVar8 = local_98;
      if (SQRT(fVar10 * fVar10 + fVar12 * fVar12 + fVar13 * fVar13) < local_98) {
        local_158._0_4_ =
             (float)local_158 * fVar11 +
             (float)local_b8._0_4_ * (float)local_68 + local_88 * local_68._4_4_;
        fVar11 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
        fVar8 = local_9c;
        if ((local_9c <= fVar11 + (float)local_158) &&
           ((float)local_c8._0_4_ <= fVar11 + (float)local_158 || !bVar5)) {
          local_f8._0_8_ =
               (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                  .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                  super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_f8.z = fVar8;
          local_58._0_8_ = (**(code **)(*plVar1 + 0x40))(plVar1);
          local_58.z = fVar8;
          OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
          annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *
                         )this,&local_f8,&local_58,(Color *)(anonymous_namespace)::clearPathColor);
          local_ec = 0;
        }
      }
    }
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  local_d8 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x10))(this);
  fVar8 = fVar8 * local_98;
  local_b8._0_4_ = fVar8;
  local_138 = (undefined1  [8])
              (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
  fStack_130 = (float)extraout_XMM0_Dc_01;
  fStack_12c = (float)extraout_XMM0_Dd_01;
  local_158._0_4_ = fVar8;
  local_128 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                 super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                 .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                 super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
  fVar8 = fVar8 - (float)local_158 * local_78;
  local_158._0_4_ = fVar8;
  fStack_120 = extraout_XMM0_Dc_02;
  fStack_11c = extraout_XMM0_Dd_02;
  uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                             super_AbstractVehicle.super_AbstractLocalSpace + 0xa0))(this,&local_e8)
  ;
  fVar14 = DAT_0017b020;
  fVar8 = fVar8 * local_98;
  local_c8._0_4_ = fVar8;
  local_128._0_4_ = (float)local_128 - local_78 * (float)local_138._0_4_;
  local_128._4_4_ = local_128._4_4_ - local_78 * (float)local_138._4_4_;
  fStack_120 = fStack_120 - local_78 * fStack_130;
  fStack_11c = fStack_11c - local_78 * fStack_12c;
  fStack_94 = local_98;
  fStack_90 = local_98;
  fStack_8c = local_98;
  local_68._0_4_ = (float)uVar9 * local_98;
  local_68._4_4_ = (float)((ulong)uVar9 >> 0x20) * local_98;
  fStack_60 = extraout_XMM0_Dc_03 * local_98;
  fStack_5c = extraout_XMM0_Dd_03 * local_98;
  local_168.x = (float)local_128 + (float)local_68;
  local_168.y = local_128._4_4_ + local_68._4_4_;
  local_168.z = (float)local_158 + fVar8;
  local_138._4_4_ = (anonymous_namespace)::gHomeBaseCenter._4_4_;
  local_138._0_4_ = (float)(anonymous_namespace)::gHomeBaseCenter;
  _fStack_130 = 0;
  local_88 = (float)(anonymous_namespace)::gHomeBaseCenter + (float)local_68;
  fStack_84 = (anonymous_namespace)::gHomeBaseCenter._4_4_ + local_68._4_4_;
  fStack_80 = fStack_60 + 0.0;
  fStack_7c = fStack_5c + 0.0;
  fVar8 = fVar8 + DAT_0017b020;
  local_f8.y = fStack_84;
  local_f8.x = local_88;
  local_f8.z = fVar8;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_f8,(Color *)(anonymous_namespace)::clearPathColor);
  local_168.z = (float)local_158 - (float)local_c8._0_4_;
  local_168.y = local_128._4_4_ - local_68._4_4_;
  local_168.x = (float)local_128 - (float)local_68;
  local_138._0_4_ = (float)local_138._0_4_ - (float)local_68;
  local_138._4_4_ = (float)local_138._4_4_ - local_68._4_4_;
  fStack_130 = fStack_130 - fStack_60;
  fStack_12c = fStack_12c - fStack_5c;
  fVar14 = fVar14 - (float)local_c8._0_4_;
  local_f8.y = (float)local_138._4_4_;
  local_f8.x = (float)local_138._0_4_;
  local_f8.z = fVar14;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_f8,(Color *)(anonymous_namespace)::clearPathColor);
  auVar3 = _local_138;
  local_168.x = (float)local_138._0_4_;
  local_168.y = (float)local_138._4_4_;
  local_f8.y = fStack_84;
  local_f8.x = local_88;
  local_168.z = fVar14;
  _local_138 = auVar3;
  local_f8.z = fVar8;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_f8,(Color *)(anonymous_namespace)::clearPathColor);
  fVar8 = (float)local_158 - (float)local_b8._0_4_;
  local_168.y = local_128._4_4_ - fStack_94 * local_d8._4_4_;
  local_168.x = (float)local_128 - local_98 * (float)local_d8;
  local_f8.x = local_98 * (float)local_d8 + (float)local_128;
  local_f8.y = fStack_94 * local_d8._4_4_ + local_128._4_4_;
  local_f8.z = (float)local_158 + (float)local_b8._0_4_;
  local_168.z = fVar8;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_168,&local_f8,(Color *)(anonymous_namespace)::clearPathColor);
  uVar4 = local_ec;
  if ((local_ec & 1) == 0) {
    this->evading = true;
    fVar14 = 0.9;
  }
  else {
    this->evading = false;
    uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                               super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                               .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                               super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
    local_128._0_4_ = (float)(anonymous_namespace)::gHomeBaseCenter;
    local_138._0_4_ = (anonymous_namespace)::gHomeBaseCenter._4_4_;
    local_158._0_4_ = DAT_0017b020;
    local_d8 = uVar9;
    bVar5 = OpenSteer::
            SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
            ::isAhead((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                       *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter,0.98);
    fVar11 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                       super_SimpleVehicle_3.
                                       super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                       .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                       super_AbstractVehicle.super_AbstractLocalSpace + 0xd8))(this)
    ;
    fVar14 = 0.9;
    if (bVar5) {
      uVar7 = -(uint)(2.0 <= SQRT(((float)local_158 - fVar8) * ((float)local_158 - fVar8) +
                                  ((float)local_128 - (float)local_d8) *
                                  ((float)local_128 - (float)local_d8) +
                                  ((float)local_138._0_4_ - local_d8._4_4_) *
                                  ((float)local_138._0_4_ - local_d8._4_4_)) / fVar11);
      fVar14 = (float)(~uVar7 & 0x3f666666 | uVar7 & 0x40000000);
    }
  }
  VVar17 = OpenSteer::
           SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
           ::steerToAvoidObstacles
                     ((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                       *)this,fVar14,(ObstacleGroup *)&(anonymous_namespace)::CtfBase::allObstacles)
  ;
  fVar8 = VVar17.z;
  fVar14 = VVar17.y;
  auVar16._0_8_ = VVar17._0_8_;
  auVar16._8_4_ = extraout_XMM0_Dc_04;
  auVar16._12_4_ = extraout_XMM0_Dd_04;
  if ((((VVar17.x != OpenSteer::Vec3::zero.x) || (NAN(VVar17.x) || NAN(OpenSteer::Vec3::zero.x))) ||
      (fVar14 != OpenSteer::Vec3::zero.y)) || (NAN(fVar14) || NAN(OpenSteer::Vec3::zero.y))) {
    (this->super_CtfBase).avoiding = true;
  }
  else {
    bVar5 = NAN(OpenSteer::Vec3::zero.z);
    bVar2 = fVar8 == OpenSteer::Vec3::zero.z;
    (this->super_CtfBase).avoiding = fVar8 != OpenSteer::Vec3::zero.z;
    if ((bVar2) && (!NAN(fVar8) && !bVar5)) {
      VVar17 = OpenSteer::
               SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
               ::xxxsteerForSeek((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                  *)this,(Vec3 *)&(anonymous_namespace)::gHomeBaseCenter);
      fVar8 = VVar17.z;
      local_f8._0_8_ = VVar17._0_8_;
      local_f8.z = fVar8;
      if ((uVar4 & 1) == 0) {
        uStack_c0 = extraout_XMM0_Dc_05;
        local_c8._0_4_ = local_f8.x;
        local_c8._4_4_ = local_f8.y;
        uStack_bc = extraout_XMM0_Dd_05;
        fVar14 = 0.0;
        local_128._4_4_ = 0.0;
        fStack_120 = 0.0;
        fStack_11c = 0.0;
        fVar11 = 0.0;
        lVar6 = 0;
        do {
          plVar1 = *(long **)((long)&(anonymous_namespace)::ctfEnemies + lVar6);
          local_128._0_4_ = fVar14;
          local_138 = (undefined1  [8])(**(code **)(*plVar1 + 0x40))(plVar1);
          fStack_130 = (float)extraout_XMM0_Dc_07;
          fStack_12c = (float)extraout_XMM0_Dd_07;
          local_158._0_4_ = fVar14;
          uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
          local_138._0_4_ = (float)local_138._0_4_ - (float)uVar9;
          local_138._4_4_ = (float)local_138._4_4_ - (float)((ulong)uVar9 >> 0x20);
          fStack_130 = fStack_130 - extraout_XMM0_Dc_08;
          fStack_12c = fStack_12c - extraout_XMM0_Dd_08;
          local_158._0_4_ = (float)local_158 - fVar14;
          local_d8._0_4_ =
               SQRT((float)local_158 * (float)local_158 +
                    (float)local_138._0_4_ * (float)local_138._0_4_ +
                    (float)local_138._4_4_ * (float)local_138._4_4_);
          local_b8._0_4_ = (float)local_d8 * 0.5;
          fVar14 = (float)(**(code **)(*plVar1 + 0xd8))(plVar1);
          fVar14 = (float)local_b8._0_4_ / fVar14;
          local_168._0_8_ = (**(code **)(*plVar1 + 0xe8))(fVar14,plVar1);
          local_168.z = fVar14;
          fVar14 = (float)(**(code **)(*plVar1 + 0xc0))(plVar1);
          OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
          annotationCircleOrDisk
                    ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,fVar14,&OpenSteer::Vec3::zero,&local_168,
                     (Color *)(anonymous_namespace)::evadeColor,0x14,false,false);
          VVar17 = OpenSteer::
                   SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                   ::xxxsteerForFlee((SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
                                      *)this,&local_168);
          fVar14 = VVar17.z;
          fStack_b0 = (float)extraout_XMM0_Dc_09;
          local_b8 = VVar17._0_8_;
          fStack_ac = (float)extraout_XMM0_Dd_09;
          local_88 = fVar14;
          uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3
                                     .
                                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                     .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                     super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
          local_158._0_4_ =
               fVar14 * (float)local_158 +
               local_138._0_4_ * (float)uVar9 + local_138._4_4_ * (float)((ulong)uVar9 >> 0x20);
          fVar14 = (float)(**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.
                                             super_SimpleVehicle_3.
                                             super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                             .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                             super_AbstractVehicle.super_AbstractLocalSpace + 0xc0))
                                    (this);
          fVar10 = 4.0 / (float)local_d8;
          fVar13 = *(float *)(&DAT_00147cf0 + (ulong)(fVar14 * -2.0 < (float)local_158) * 4);
          fVar11 = fVar11 + local_88 * fVar10 * fVar13;
          fVar14 = (float)local_128 + fVar13 * fVar10 * (float)local_b8._0_4_;
          local_128._4_4_ = local_128._4_4_ + fVar13 * fVar10 * (float)local_b8._4_4_;
          fStack_120 = fStack_120 + fVar13 * fVar10 * fStack_b0;
          fStack_11c = fStack_11c + fVar13 * fVar10 * fStack_ac;
          lVar6 = lVar6 + 8;
        } while (lVar6 != 0x20);
        fVar13 = fVar8 + fVar11;
        local_168.y = (float)local_c8._4_4_ + local_128._4_4_;
        local_168.x = (float)local_c8._0_4_ + fVar14;
        local_168.z = fVar13;
        local_128._0_4_ = fVar14;
        local_e8._0_8_ =
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
        local_e8.z = fVar13;
        VVar17 = OpenSteer::vecLimitDeviationAngleUtility(true,&local_168,0.707,&local_e8);
        fVar14 = VVar17.z;
        fStack_130 = (float)extraout_XMM0_Dc_10;
        local_138 = (undefined1  [8])VVar17._0_8_;
        fStack_12c = (float)extraout_XMM0_Dd_10;
        local_158._0_4_ = fVar14;
        local_168._0_8_ =
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_168.z = fVar14;
        uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        fVar14 = fVar14 + fVar8;
        local_e8.y = (float)((ulong)uVar9 >> 0x20) + (float)local_c8._4_4_;
        local_e8.x = (float)uVar9 + (float)local_c8._0_4_;
        local_e8.z = fVar14;
        OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
        annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                       this,&local_168,&local_e8,(Color *)OpenSteer::gRed);
        local_168._0_8_ =
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_168.z = fVar14;
        uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        fVar14 = fVar14 + fVar11;
        local_e8.y = (float)((ulong)uVar9 >> 0x20) + local_128._4_4_;
        local_e8.x = (float)uVar9 + (float)local_128;
        local_e8.z = fVar14;
        OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
        annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                       this,&local_168,&local_e8,(Color *)OpenSteer::gGreen);
        local_168._0_8_ =
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_168.z = fVar14;
        uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_e8.x = (float)local_138._0_4_ * 0.2 + (float)uVar9;
        local_e8.y = (float)local_138._4_4_ * 0.2 + (float)((ulong)uVar9 >> 0x20);
        local_e8.z = (float)local_158 * 0.2 + fVar14;
        color = (anonymous_namespace)::evadeColor;
      }
      else {
        local_168._0_8_ =
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x30))(this);
        local_168.z = fVar8;
        VVar17 = OpenSteer::vecLimitDeviationAngleUtility(true,&local_f8,0.707,&local_168);
        fVar8 = VVar17.z;
        fStack_130 = (float)extraout_XMM0_Dc_06;
        local_138 = (undefined1  [8])VVar17._0_8_;
        fStack_12c = (float)extraout_XMM0_Dd_06;
        local_158._0_4_ = fVar8;
        local_168._0_8_ =
             (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_168.z = fVar8;
        uVar9 = (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                                   super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                                   .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.
                                   super_AbstractVehicle.super_AbstractLocalSpace + 0x40))(this);
        local_e8.x = (float)local_138._0_4_ * 0.2 + (float)uVar9;
        local_e8.y = (float)local_138._4_4_ * 0.2 + (float)((ulong)uVar9 >> 0x20);
        local_e8.z = (float)local_158 * 0.2 + fVar8;
        color = (anonymous_namespace)::seekColor;
      }
      OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
      annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,&local_168,&local_e8,(Color *)color);
      fVar14 = local_138._4_4_;
      fVar8 = (float)local_158;
      auVar16 = _local_138;
    }
  }
  local_108.y = fVar14;
  local_108.x = auVar16._0_4_;
  local_108.z = fVar8;
LAB_0011e8f2:
  OpenSteer::SimpleVehicle::applySteeringForce((SimpleVehicle *)this,&local_108,local_13c);
  fVar8 = 3.0;
  OpenSteer::SimpleVehicle::annotationVelocityAcceleration((SimpleVehicle *)this,3.0,3.0);
  local_168._0_8_ =
       (**(code **)((long)(this->super_CtfBase).super_SimpleVehicle.super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
                          super_AbstractLocalSpace + 0x40))(this);
  local_168.z = fVar8;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                    ,local_10c,&local_168);
  return;
}

Assistant:

void CtfSeeker::update (const float currentTime, const float elapsedTime)
    {
        // do behavioral state transitions, as needed
        updateState (currentTime);

        // determine and apply steering/braking forces
        Vec3 steer (0, 0, 0);
        if (state == running)
        {
            steer = steeringForSeeker ();
        }
        else
        {
            applyBrakingForce (gBrakingRate, elapsedTime);
        }
        applySteeringForce (steer, elapsedTime);

        // annotation
        annotationVelocityAcceleration ();
        recordTrailVertex (currentTime, position());
    }